

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort.scat.c
# Opt level: O0

void ga_sort_permutation(Integer *pn,Integer *index,Integer *base)

{
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  ulong *in_RDI;
  Integer *p;
  unsigned_long g;
  unsigned_long gap;
  long ib_2;
  long ia_2;
  Integer itmp_2;
  Integer ltmp_2;
  long ib_1;
  long ia_1;
  Integer itmp_1;
  Integer ltmp_1;
  long ib;
  long ia;
  Integer itmp;
  Integer ltmp;
  Integer *base0;
  Integer n;
  Integer *hi;
  Integer *q;
  
  if (1 < (long)*in_RDI) {
    base0 = (Integer *)((long)*in_RDI >> 1);
    ib = (long)(in_RDX + (long)base0 * 2 + -1);
    if ((*in_RDI & 1) != 0) {
      ib = ib + 8;
    }
    for (; base0 != (Integer *)0x1; base0 = (Integer *)((long)base0 + -1)) {
      ltmp = (Integer)base0;
      itmp = (Integer)(in_RDX + (long)base0 + -1);
      while (ia = itmp + ltmp * 8, (ulong)ia <= (ulong)ib) {
        ltmp = ltmp * 2;
        if ((ia != ib) && (*(long *)ia < *(long *)(ia + 8))) {
          ia = ia + 8;
          ltmp = ltmp + 1;
        }
        if (*(long *)ia <= *(long *)itmp) break;
        lVar2 = itmp - (long)in_RDX >> 3;
        lVar3 = ia - (long)in_RDX >> 3;
        uVar1 = *(undefined8 *)itmp;
        *(undefined8 *)itmp = *(undefined8 *)ia;
        *(undefined8 *)ia = uVar1;
        uVar1 = in_RSI[lVar2];
        in_RSI[lVar2] = in_RSI[lVar3];
        in_RSI[lVar3] = uVar1;
        itmp = ia;
      }
    }
    for (; (undefined8 *)ib != in_RDX; ib = ib + -8) {
      ltmp = 1;
      itmp = (Integer)in_RDX;
      while (ia = itmp + ltmp * 8, (ulong)ia <= (ulong)ib) {
        ltmp = ltmp * 2;
        if ((ia != ib) && (*(long *)ia < *(long *)(ia + 8))) {
          ia = ia + 8;
          ltmp = ltmp + 1;
        }
        if (*(long *)ia <= *(long *)itmp) break;
        lVar2 = itmp - (long)in_RDX >> 3;
        lVar3 = ia - (long)in_RDX >> 3;
        uVar1 = *(undefined8 *)itmp;
        *(undefined8 *)itmp = *(undefined8 *)ia;
        *(undefined8 *)ia = uVar1;
        uVar1 = in_RSI[lVar2];
        in_RSI[lVar2] = in_RSI[lVar3];
        in_RSI[lVar3] = uVar1;
        itmp = ia;
      }
      lVar2 = ib - (long)in_RDX >> 3;
      uVar1 = *in_RDX;
      *in_RDX = *(undefined8 *)ib;
      *(undefined8 *)ib = uVar1;
      uVar1 = *in_RSI;
      *in_RSI = in_RSI[lVar2];
      in_RSI[lVar2] = uVar1;
    }
  }
  return;
}

Assistant:

void ga_sort_permutation(pn, index, base)
     Integer *pn;
     Integer *index;
     Integer *base;
{
  if (*pn < 2) return;
#  undef SWAP  
#  define SWAP(a,b) { \
    Integer ltmp; \
    Integer itmp;\
    long ia = a - base; \
    long ib = b - base; \
    ltmp=*a; *a=*b; *b=ltmp; \
    itmp=index[ia]; index[ia]=index[ib]; index[ib] = itmp;\
   }
  INDEX_SORT(base,pn,SWAP);
}